

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pIVar6;
  pointer pTVar7;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> local_1c0;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr_3;
  Location local_170;
  Enum local_150;
  Enum local_14c;
  Enum local_148;
  Enum local_144;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> local_140;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> expr_2;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  local_e8;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
  expr_1;
  int local_90;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
  local_88;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
  expr;
  undefined1 local_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)local_40,this);
  TVar2 = Peek(this,0);
  if (TVar2 == Block) {
    Consume((Token *)&expr,this);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>
              ((wabt *)&local_88,(Location *)local_40);
    pBVar4 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
             ::operator->(&local_88);
    RVar3 = ParseLabelOpt(this,&(pBVar4->block).label);
    bVar1 = Failed(RVar3);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      pBVar4 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
               ::operator->(&local_88);
      RVar3 = ParseBlock(this,&pBVar4->block);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        RVar3 = Expect(this,End);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pBVar4 = std::
                   unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                   ::operator->(&local_88);
          RVar3 = ParseEndLabelOpt(this,&(pBVar4->block).label);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       &local_88);
            local_90 = 2;
          }
        }
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
    ::~unique_ptr(&local_88);
    goto joined_r0x002bb207;
  }
  if (TVar2 != If) {
    if (TVar2 == Loop) {
      Consume((Token *)&expr_1,this);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Location&>
                ((wabt *)&local_e8,(Location *)local_40);
      pBVar5 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
               ::operator->(&local_e8);
      RVar3 = ParseLabelOpt(this,&(pBVar5->block).label);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        pBVar5 = std::
                 unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
                 ::operator->(&local_e8);
        RVar3 = ParseBlock(this,&pBVar5->block);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          RVar3 = Expect(this,End);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            pBVar5 = std::
                     unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
                     ::operator->(&local_e8);
            RVar3 = ParseEndLabelOpt(this,&(pBVar5->block).label);
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_
                         ,&local_e8);
              local_90 = 2;
            }
          }
        }
      }
      std::
      unique_ptr<wabt::BlockExprBase<(wabt::ExprType)26>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)26>_>_>
      ::~unique_ptr(&local_e8);
    }
    else {
      if (TVar2 != Try) {
        __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                      ,0xa13,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
      }
      Consume((Token *)&expr_3,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&expr_3);
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_1c0,(Location *)local_40);
      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         (&local_1c0);
      RVar3 = ParseLabelOpt(this,&(pTVar7->block).label);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_90 = 1;
      }
      else {
        pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                           (&local_1c0);
        RVar3 = ParseBlock(this,&pTVar7->block);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          RVar3 = Expect(this,Catch);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               (&local_1c0);
            RVar3 = ParseEndLabelOpt(this,&(pTVar7->block).label);
            bVar1 = Failed(RVar3);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_90 = 1;
            }
            else {
              pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                       operator->(&local_1c0);
              RVar3 = ParseTerminatingInstrList(this,&pTVar7->catch_);
              bVar1 = Failed(RVar3);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_90 = 1;
              }
              else {
                RVar3 = Expect(this,End);
                bVar1 = Failed(RVar3);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_90 = 1;
                }
                else {
                  pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                           operator->(&local_1c0);
                  RVar3 = ParseEndLabelOpt(this,&(pTVar7->block).label);
                  bVar1 = Failed(RVar3);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    local_90 = 1;
                  }
                  else {
                    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)
                               loc.field_1._8_8_,&local_1c0);
                    local_90 = 2;
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr(&local_1c0);
    }
    goto joined_r0x002bb207;
  }
  Consume((Token *)&expr_2,this);
  MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_140,(Location *)local_40);
  pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->(&local_140)
  ;
  local_144 = (Enum)ParseLabelOpt(this,&(pIVar6->true_).label);
  bVar1 = Failed((Result)local_144);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_90 = 1;
  }
  else {
    pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       (&local_140);
    local_148 = (Enum)ParseBlock(this,&pIVar6->true_);
    bVar1 = Failed((Result)local_148);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_90 = 1;
    }
    else {
      bVar1 = Match(this,Else);
      if (bVar1) {
        pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                           (&local_140);
        local_14c = (Enum)ParseEndLabelOpt(this,&(pIVar6->true_).label);
        bVar1 = Failed((Result)local_14c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             (&local_140);
          local_150 = (Enum)ParseTerminatingInstrList(this,&pIVar6->false_);
          bVar1 = Failed((Result)local_150);
          if (!bVar1) {
            GetLocation(&local_170,this);
            pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               (&local_140);
            (pIVar6->false_end_loc).filename.data_ = local_170.filename.data_;
            (pIVar6->false_end_loc).filename.size_ = local_170.filename.size_;
            (pIVar6->false_end_loc).field_1.field_1.offset =
                 (size_t)local_170.field_1.field_1.offset;
            *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_170.field_1._8_8_;
            goto LAB_002bb5ba;
          }
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
      }
      else {
LAB_002bb5ba:
        RVar3 = Expect(this,End);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_90 = 1;
        }
        else {
          pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             (&local_140);
          RVar3 = ParseEndLabelOpt(this,&(pIVar6->true_).label);
          bVar1 = Failed(RVar3);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_90 = 1;
          }
          else {
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                       &local_140);
            local_90 = 2;
          }
        }
      }
    }
  }
  std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr(&local_140);
joined_r0x002bb207:
  if (local_90 != 1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}